

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_present_video(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_present_video != 0) {
    glad_glPresentFrameKeyedNV = (PFNGLPRESENTFRAMEKEYEDNVPROC)(*load)("glPresentFrameKeyedNV");
    glad_glPresentFrameDualFillNV =
         (PFNGLPRESENTFRAMEDUALFILLNVPROC)(*load)("glPresentFrameDualFillNV");
    glad_glGetVideoivNV = (PFNGLGETVIDEOIVNVPROC)(*load)("glGetVideoivNV");
    glad_glGetVideouivNV = (PFNGLGETVIDEOUIVNVPROC)(*load)("glGetVideouivNV");
    glad_glGetVideoi64vNV = (PFNGLGETVIDEOI64VNVPROC)(*load)("glGetVideoi64vNV");
    glad_glGetVideoui64vNV = (PFNGLGETVIDEOUI64VNVPROC)(*load)("glGetVideoui64vNV");
  }
  return;
}

Assistant:

static void load_GL_NV_present_video(GLADloadproc load) {
	if(!GLAD_GL_NV_present_video) return;
	glad_glPresentFrameKeyedNV = (PFNGLPRESENTFRAMEKEYEDNVPROC)load("glPresentFrameKeyedNV");
	glad_glPresentFrameDualFillNV = (PFNGLPRESENTFRAMEDUALFILLNVPROC)load("glPresentFrameDualFillNV");
	glad_glGetVideoivNV = (PFNGLGETVIDEOIVNVPROC)load("glGetVideoivNV");
	glad_glGetVideouivNV = (PFNGLGETVIDEOUIVNVPROC)load("glGetVideouivNV");
	glad_glGetVideoi64vNV = (PFNGLGETVIDEOI64VNVPROC)load("glGetVideoi64vNV");
	glad_glGetVideoui64vNV = (PFNGLGETVIDEOUI64VNVPROC)load("glGetVideoui64vNV");
}